

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void reportError(Error error)

{
  long lVar1;
  istream *piVar2;
  long lVar3;
  char cVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  long *plVar7;
  int iVar8;
  string line;
  char *local_48;
  long local_40;
  char local_38 [20];
  key_type local_24;
  
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  poVar5 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,anon_var_dwarf_7a2a,3);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,nextToken.lineNo.row + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,anon_var_dwarf_7a43,4);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,nextToken.lineNo.col);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,anon_var_dwarf_7a5c,0xe);
  pmVar6 = std::
           map<Error,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Error>,_std::allocator<std::pair<const_Error,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&errorTable_abi_cxx11_,&local_24);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(pmVar6->_M_dataplus)._M_p,pmVar6->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  plVar7 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  local_48 = local_38;
  local_40 = 0;
  local_38[0] = '\0';
  std::ios::clear((int)file + (int)*(undefined8 *)(*(long *)file + -0x18));
  std::istream::seekg((long)file,_S_beg);
  if (0 < nextToken.lineNo.row) {
    iVar8 = nextToken.lineNo.row + 1;
    do {
      piVar2 = file;
      cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + (char)file);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (piVar2,(string *)&local_48,cVar4);
      iVar8 = iVar8 + -1;
    } while (1 < iVar8);
  }
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_48,local_40);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  piVar2 = file;
  cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + (char)file);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(piVar2,(string *)&local_48,cVar4);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_48,local_40);
  std::endl<char,std::char_traits<char>>(poVar5);
  lVar1 = *(long *)(std::cout + -0x18);
  if (*(char *)(lVar1 + 0x1111f1) == '\0') {
    std::ios::widen((char)lVar1 + '\x10');
    *(undefined1 *)(lVar1 + 0x1111f1) = 1;
  }
  lVar3 = std::cout;
  *(undefined1 *)(lVar1 + 0x1111f0) = 0x20;
  *(long *)(std::istream::get + *(long *)(lVar3 + -0x18)) = (long)nextToken.lineNo.col + -1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"~~~~~~^",7);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  system("pause");
  exit(0);
}

Assistant:

void reportError(Error error)
{
    cout<<endl<<"行"<<nextToken.lineNo.row+1<<" 列"<<nextToken.lineNo.col<<" 出现错误:"<<errorTable[error]<<endl<<endl;
    string line;
    file->clear();
    file->seekg(0,ios::beg);
    for(int i=nextToken.lineNo.row;i>0;i--)
        getline(*file,line);
    cout<<line<<endl;
    getline(*file,line);
    cout<<line<<endl;
    cout.fill(' ');
    cout.width(nextToken.lineNo.col-1);
    cout<<"~~~~~~^"<<endl;
    system("pause");
    exit(0);
}